

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_partial_sig_parse
              (secp256k1_context *ctx,secp256k1_musig_partial_sig *sig,uchar *in32)

{
  secp256k1_callback *in_RDX;
  uchar *in_RSI;
  secp256k1_scalar *in_RDI;
  int overflow;
  secp256k1_scalar tmp;
  int in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  int local_4;
  
  if (in_RDI == (secp256k1_scalar *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/session_impl.h"
            ,0x116,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (uchar *)0x0) {
    secp256k1_callback_call
              (in_RDX,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    local_4 = 0;
  }
  else if (in_RDX == (secp256k1_callback *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)0x0,
               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    local_4 = 0;
  }
  else {
    memset(in_RSI,0,0x24);
    secp256k1_scalar_set_b32(in_RDI,in_RSI,(int *)in_RDX);
    if (in_stack_ffffffffffffffd8 == 0) {
      secp256k1_musig_partial_sig_save
                ((secp256k1_musig_partial_sig *)in_RDX,
                 (secp256k1_scalar *)((ulong)in_stack_ffffffffffffffdc << 0x20));
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_musig_partial_sig_parse(const secp256k1_context* ctx, secp256k1_musig_partial_sig* sig, const unsigned char *in32) {
    secp256k1_scalar tmp;
    int overflow;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(in32 != NULL);

    /* Ensure that using the signature will fail if parsing fails (and the user
     * doesn't check the return value). */
    memset(sig, 0, sizeof(*sig));

    secp256k1_scalar_set_b32(&tmp, in32, &overflow);
    if (overflow) {
        return 0;
    }
    secp256k1_musig_partial_sig_save(sig, &tmp);
    return 1;
}